

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::restrictInteriorNodes
          (MLNodeLaplacian *this,int camrlev,MultiFab *crhs,MultiFab *a_frhs)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  LinOpBCType LVar1;
  LinOpBCType LVar2;
  undefined8 uVar3;
  pointer pVVar4;
  Geometry *this_00;
  pointer paVar5;
  pointer paVar6;
  ulong uVar7;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_01;
  __uniq_ptr_data<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>,_true,_true>
  _Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  FabArray<amrex::FArrayBox> *pFVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  int iVar39;
  int ioff;
  int iVar40;
  long lVar41;
  int iVar42;
  bool bVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  undefined1 auVar65 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar121;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  double dVar140;
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  double dVar146;
  double dVar147;
  double dVar148;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  double dVar149;
  double dVar161;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  double dVar162;
  double dVar163;
  double dVar164;
  undefined1 auVar166 [16];
  double dVar165;
  double dVar170;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  double dVar171;
  double dVar172;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  double dVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  double dVar184;
  double dVar185;
  Periodicity PVar186;
  Box bx;
  MFIter mfi_1;
  MultiFab tmp_crhs;
  MultiFab cfine;
  long local_8c0;
  int local_840;
  int local_838;
  int local_830;
  Box local_7e4;
  double local_7c8;
  undefined8 uStack_7c0;
  double local_7b8;
  double dStack_7b0;
  FabArray<amrex::FArrayBox> *local_7a0;
  MLNodeLaplacian *local_798;
  ulong local_790;
  long local_788;
  ulong local_780;
  long local_778;
  long local_770;
  double local_768;
  undefined8 uStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  undefined8 uStack_740;
  FabArray<amrex::FArrayBox> *local_738;
  ulong local_730;
  long local_728;
  double *local_720;
  double *local_718;
  double *local_710;
  double *local_708;
  undefined **local_700;
  undefined **local_6f8;
  uint local_6f0;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  Array4<const_double> local_6d8;
  Array4<const_double> local_698;
  undefined8 local_658;
  int iStack_650;
  int aiStack_64c [2];
  undefined8 uStack_644;
  ulong local_638;
  FabArray<amrex::FArrayBox> *local_630;
  long local_628;
  long local_620;
  undefined **local_618;
  undefined **local_610;
  long local_608;
  long local_600;
  long local_5f8;
  undefined **local_5f0;
  undefined **local_5e8;
  double *local_5e0;
  double *local_5d8;
  double *local_5d0;
  undefined1 local_5c8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_5b8;
  int local_5a0;
  Vector<int,_std::allocator<int>_> *local_588;
  double local_568;
  undefined8 uStack_560;
  double *local_558;
  undefined8 uStack_550;
  double *local_548;
  undefined8 uStack_540;
  double local_538;
  undefined8 uStack_530;
  long local_520;
  Geometry *local_518;
  pointer local_510;
  long local_508;
  FabArray<amrex::IArrayBox> *local_500;
  ulong local_4f8;
  long local_4f0;
  long local_4e8;
  long local_4e0;
  long local_4d8;
  long local_4d0;
  ulong local_4c8;
  long local_4c0;
  undefined **local_4b8;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  long local_498;
  double *local_490;
  double *local_488;
  double *local_480;
  double *local_478;
  double *local_470;
  double *local_468;
  double *local_460;
  double *local_458;
  double *local_450;
  double *local_448;
  double *local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  undefined **local_3e8;
  double *local_3e0;
  undefined **local_3d8;
  undefined **local_3d0;
  double *local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  Array4<const_double> local_3a8;
  double local_368;
  undefined8 uStack_360;
  double local_358;
  undefined8 uStack_350;
  FabArray<amrex::FArrayBox> local_348;
  MFItInfo local_1c4;
  undefined1 local_1b0 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_1a0 [15];
  
  bxs = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  lVar23 = (long)camrlev;
  uVar13 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar23];
  local_638 = (ulong)uVar13;
  uVar3 = *(undefined8 *)(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  iVar24 = uVar13 - 1;
  local_798 = this;
  local_738 = &crhs->super_FabArray<amrex::FArrayBox>;
  if ((((int)uVar3 < iVar24) || ((int)((ulong)uVar3 >> 0x20) < iVar24)) ||
     ((a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < iVar24)) {
    pFVar17 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
    local_1b0._0_8_ = (_func_int **)0x1;
    local_1b0._8_8_ = (Arena *)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    avStack_1a0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_348.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)&PTR__FabFactory_0080b918;
    MultiFab::MultiFab((MultiFab *)pFVar17,bxs,dm,1,iVar24,(MFInfo *)local_1b0,
                       (FabFactory<amrex::FArrayBox> *)&local_348);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(avStack_1a0);
    local_7a0 = pFVar17;
    MultiFab::Copy((MultiFab *)pFVar17,a_frhs,0,0,1,0);
  }
  else {
    local_7a0 = (FabArray<amrex::FArrayBox> *)0x0;
    pFVar17 = &a_frhs->super_FabArray<amrex::FArrayBox>;
  }
  pVVar4 = (local_798->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_518 = *(Geometry **)
               &pVVar4[lVar23].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_508 = (long)(camrlev + 1);
  this_00 = *(Geometry **)
             &pVVar4[local_508].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_658 = *(undefined8 *)(this_00->domain).smallend.vect;
  uVar3 = *(undefined8 *)((this_00->domain).smallend.vect + 2);
  aiStack_64c[1] = (int)((ulong)*(undefined8 *)(this_00->domain).bigend.vect >> 0x20);
  uStack_644 = *(undefined8 *)((this_00->domain).bigend.vect + 2);
  iStack_650 = (int)uVar3;
  aiStack_64c[0] = (int)((ulong)uVar3 >> 0x20);
  lVar19 = 0;
  do {
    if ((uStack_644._4_4_ >> ((uint)lVar19 & 0x1f) & 1) == 0) {
      aiStack_64c[lVar19] = aiStack_64c[lVar19] + 1;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  uStack_644 = CONCAT44(7,(undefined4)uStack_644);
  paVar5 = (local_798->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar6 = (local_798->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(undefined8 *)paVar5->_M_elems;
  LVar1 = paVar5->_M_elems[2];
  uVar7 = *(ulong *)paVar6->_M_elems;
  LVar2 = paVar6->_M_elems[2];
  local_500 = (FabArray<amrex::IArrayBox> *)
              **(undefined8 **)
                &(local_798->super_MLNodeLinOp).m_dirichlet_mask.
                 super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 .
                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[local_508].
                 super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  local_510 = (local_798->m_nosigma_stencil).
              super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              .
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_630 = pFVar17;
  local_520 = lVar23;
  amrex::coarsen((BoxArray *)&local_348,bxs,(int)local_638);
  local_5c8._1_7_ = 0;
  local_5c8[0] = true;
  local_5c8._8_4_ = 0;
  local_5c8._12_4_ = 0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.p = (double *)&PTR__FabFactory_0080b918;
  MultiFab::MultiFab((MultiFab *)local_1b0,(BoxArray *)&local_348,dm,1,0,(MFInfo *)local_5c8,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_5b8);
  BoxArray::~BoxArray((BoxArray *)&local_348);
  pFVar17 = local_630;
  FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            (local_630,0.0,0,(local_630->super_FabArrayBase).n_comp);
  local_348.super_FabArrayBase._0_12_ = Geometry::periodicity(this_00);
  FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar17,(Periodicity *)&local_348,false);
  MFIter::MFIter((MFIter *)&local_348,(FabArrayBase *)local_1b0,true);
  iVar12 = aiStack_64c[0];
  iVar24 = iStack_650;
  if (local_348.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] <
      local_348.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]) {
    local_770 = CONCAT44(local_770._4_4_,(undefined4)local_658);
    local_778 = CONCAT44(local_778._4_4_,local_658._4_4_);
    local_780 = CONCAT44(local_780._4_4_,aiStack_64c[1]);
    local_788 = CONCAT44(local_788._4_4_,(undefined4)uStack_644);
    local_790 = uVar7 >> 0x20;
    do {
      MFIter::tilebox(&local_7e4,(MFIter *)&local_348);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_5c8,(FabArray<amrex::FArrayBox> *)local_1b0,
                 (MFIter *)&local_348);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_6d8,local_630,(MFIter *)&local_348);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_698,local_500,(MFIter *)&local_348);
      if ((local_798->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
        local_748 = (double)CONCAT44(local_748._4_4_,local_7e4.bigend.vect[2]);
        local_830 = (int)uVar3;
        local_840 = (int)uVar7;
        local_838 = (int)((ulong)uVar3 >> 0x20);
        if ((int)local_638 == 2) {
          if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
            local_768 = (double)(ulong)(uint)local_7e4.bigend.vect[1];
            local_758 = (double)CONCAT44(local_758._4_4_,local_7e4.smallend.vect[0] * 2);
            dVar53 = (double)(ulong)(uint)local_7e4.smallend.vect[2];
            do {
              local_7c8 = dVar53;
              if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
                lVar23 = (long)(int)local_7c8._0_4_ * 2;
                local_8c0 = (long)local_7e4.smallend.vect[1];
                do {
                  if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                    local_7b8 = (double)((local_8c0 -
                                         vStack_5b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                                         CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                         CONCAT71(local_5c8._1_7_,local_5c8[0]) +
                                        ((long)(int)local_7c8._0_4_ - (long)local_5a0) *
                                        (long)vStack_5b8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start * 8);
                    lVar19 = (long)local_7e4.smallend.vect[0];
                    iVar33 = local_7e4.smallend.vect[0] * 2;
                    do {
                      dVar54 = 0.0;
                      dVar53 = 0.0;
                      if (*(int *)((long)local_698.p +
                                  (lVar19 * 2 - (long)local_698.begin.x) * 4 +
                                  (local_8c0 * 2 - (long)local_698.begin.y) * local_698.jstride * 4
                                  + (lVar23 - local_698.begin.z) * local_698.kstride * 4) == 0) {
                        iVar28 = -1;
                        do {
                          iVar14 = -iVar28;
                          if (iVar28 < 1) {
                            iVar14 = iVar28;
                          }
                          iVar9 = (int)lVar23;
                          iVar42 = iVar28 + iVar9;
                          iVar30 = -1;
                          do {
                            iVar15 = -iVar30;
                            if (iVar30 < 1) {
                              iVar15 = iVar30;
                            }
                            iVar10 = (int)(local_8c0 * 2);
                            iVar16 = iVar30 + iVar10;
                            iVar40 = -1;
                            do {
                              iVar11 = -iVar40;
                              if (iVar40 < 1) {
                                iVar11 = iVar40;
                              }
                              iVar39 = iVar33 + iVar40;
                              if (((iVar39 < (int)local_770) &&
                                  ((local_830 == 0x66 || (local_830 == 0x6a)))) ||
                                 ((iVar12 < iVar39 && ((local_840 == 0x66 || (local_840 == 0x6a)))))
                                 ) {
                                iVar39 = (int)(lVar19 * 2) - iVar40;
                              }
                              if (((iVar16 < (int)local_778) &&
                                  ((local_838 == 0x66 || (local_838 == 0x6a)))) ||
                                 ((iVar25 = iVar16, (int)local_780 < iVar16 &&
                                  (((int)local_790 == 0x6a || ((int)local_790 == 0x66)))))) {
                                iVar25 = iVar10 - iVar30;
                              }
                              if (((iVar42 < iVar24) && ((LVar1 == Neumann || (LVar1 == inflow))))
                                 || ((iVar27 = iVar42, (int)local_788 < iVar42 &&
                                     ((LVar2 == inflow || (LVar2 == Neumann)))))) {
                                iVar27 = iVar9 - iVar28;
                              }
                              dVar53 = dVar53 + (double)(iVar11 + 2) * (double)(iVar15 + 2) *
                                                (double)(iVar14 + 2) *
                                                (double)local_6d8.p
                                                        [((long)iVar25 - (long)local_6d8.begin.y) *
                                                         local_6d8.jstride +
                                                         ((long)iVar39 - (long)local_6d8.begin.x) +
                                                         ((long)iVar27 - (long)local_6d8.begin.z) *
                                                         local_6d8.kstride];
                              iVar40 = iVar40 + 1;
                            } while (iVar40 != 2);
                            iVar30 = iVar30 + 1;
                          } while (iVar30 != 2);
                          iVar28 = iVar28 + 1;
                        } while (iVar28 != 2);
                        dVar54 = dVar53 * 0.015625;
                      }
                      *(double *)
                       ((long)local_7b8 +
                       (lVar19 - (int)vStack_5b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                           dVar54;
                      lVar19 = lVar19 + 1;
                      iVar33 = iVar33 + 2;
                    } while (local_7e4.bigend.vect[0] + 1U != (int)lVar19);
                  }
                  local_8c0 = local_8c0 + 1;
                } while (local_7e4.bigend.vect[1] + 1U != (int)local_8c0);
              }
              dVar53 = (double)(ulong)(local_7c8._0_4_ + 1);
            } while (local_7c8._0_4_ != local_7e4.bigend.vect[2]);
          }
        }
        else if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
          local_768 = (double)(ulong)(uint)local_7e4.bigend.vect[1];
          local_758 = (double)CONCAT44(local_758._4_4_,local_7e4.smallend.vect[0] * 4);
          dVar53 = (double)(ulong)(uint)local_7e4.smallend.vect[2];
          do {
            local_7c8 = dVar53;
            if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
              lVar23 = (long)(int)local_7c8._0_4_ * 4;
              local_8c0 = (long)local_7e4.smallend.vect[1];
              do {
                if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                  local_7b8 = (double)((local_8c0 -
                                       vStack_5b8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                                       CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                       CONCAT71(local_5c8._1_7_,local_5c8[0]) +
                                      ((long)(int)local_7c8._0_4_ - (long)local_5a0) *
                                      (long)vStack_5b8.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start * 8);
                  lVar19 = (long)local_7e4.smallend.vect[0];
                  iVar33 = local_7e4.smallend.vect[0] * 4;
                  do {
                    dVar53 = 0.0;
                    if (*(int *)((long)local_698.p +
                                (lVar19 * 4 - (long)local_698.begin.x) * 4 +
                                (local_8c0 * 4 - (long)local_698.begin.y) * local_698.jstride * 4 +
                                (lVar23 - local_698.begin.z) * local_698.kstride * 4) == 0) {
                      iVar28 = -3;
                      do {
                        iVar14 = -iVar28;
                        if (iVar28 < 1) {
                          iVar14 = iVar28;
                        }
                        iVar9 = (int)lVar23;
                        iVar42 = iVar28 + iVar9;
                        iVar30 = -3;
                        do {
                          iVar15 = -iVar30;
                          if (iVar30 < 1) {
                            iVar15 = iVar30;
                          }
                          iVar10 = (int)(local_8c0 * 4);
                          iVar16 = iVar30 + iVar10;
                          iVar40 = -3;
                          do {
                            iVar11 = -iVar40;
                            if (iVar40 < 1) {
                              iVar11 = iVar40;
                            }
                            iVar39 = iVar33 + iVar40;
                            if (((iVar39 < (int)local_770) &&
                                ((local_830 == 0x66 || (local_830 == 0x6a)))) ||
                               ((iVar12 < iVar39 && ((local_840 == 0x66 || (local_840 == 0x6a))))))
                            {
                              iVar39 = (int)(lVar19 * 4) - iVar40;
                            }
                            if (((iVar16 < (int)local_778) &&
                                ((local_838 == 0x66 || (local_838 == 0x6a)))) ||
                               ((iVar25 = iVar16, (int)local_780 < iVar16 &&
                                (((int)local_790 == 0x6a || ((int)local_790 == 0x66)))))) {
                              iVar25 = iVar10 - iVar30;
                            }
                            if (((iVar42 < iVar24) && ((LVar1 == Neumann || (LVar1 == inflow)))) ||
                               ((iVar27 = iVar42, (int)local_788 < iVar42 &&
                                ((LVar2 == inflow || (LVar2 == Neumann)))))) {
                              iVar27 = iVar9 - iVar28;
                            }
                            dVar53 = dVar53 + (double)(iVar11 + 4) * (double)(iVar15 + 4) *
                                              (double)(iVar14 + 4) *
                                              (double)local_6d8.p
                                                      [((long)iVar25 - (long)local_6d8.begin.y) *
                                                       local_6d8.jstride +
                                                       ((long)iVar39 - (long)local_6d8.begin.x) +
                                                       ((long)iVar27 - (long)local_6d8.begin.z) *
                                                       local_6d8.kstride];
                            iVar40 = iVar40 + 1;
                          } while (iVar40 != 4);
                          iVar30 = iVar30 + 1;
                        } while (iVar30 != 4);
                        iVar28 = iVar28 + 1;
                      } while (iVar28 != 4);
                      dVar53 = dVar53 * 0.000244140625;
                    }
                    *(double *)
                     ((long)local_7b8 +
                     (lVar19 - (int)vStack_5b8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) * 8) =
                         dVar53;
                    lVar19 = lVar19 + 1;
                    iVar33 = iVar33 + 4;
                  } while (local_7e4.bigend.vect[0] + 1U != (int)lVar19);
                }
                local_8c0 = local_8c0 + 1;
              } while (local_7e4.bigend.vect[1] + 1U != (int)local_8c0);
            }
            dVar53 = (double)(ulong)(local_7c8._0_4_ + 1);
          } while (local_7c8._0_4_ != local_7e4.bigend.vect[2]);
        }
      }
      else {
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_3a8,
                   (FabArray<amrex::FArrayBox> *)
                   local_510[local_508]._M_t.
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                   (MFIter *)&local_348);
        local_6f0 = local_7e4.bigend.vect[2];
        local_730 = (ulong)(uint)local_7e4.smallend.vect[2];
        if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
          local_4c8 = (ulong)(uint)local_7e4.bigend.vect[0];
          local_4f8 = (ulong)(uint)local_7e4.bigend.vect[1];
          local_628 = (long)local_7e4.smallend.vect[1];
          local_620 = (long)local_7e4.smallend.vect[0];
          local_6dc = local_7e4.bigend.vect[0] + 1;
          local_6e0 = local_7e4.bigend.vect[1] + 1;
          do {
            if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
              local_4d0 = (long)(int)(uint)local_730;
              local_4d8 = local_4d0 * 2;
              local_3b8 = (long)local_698.begin.x;
              local_4e0 = (long)local_698.begin.y;
              local_4f0 = local_698.jstride;
              local_4e8 = (local_4d8 - local_698.begin.z) * local_698.kstride * 4 +
                          (long)local_698.p;
              iVar33 = (int)local_4d8;
              local_6e4 = iVar33 + -2;
              local_6e8 = iVar33 + -1;
              local_6ec = iVar33 + 1;
              local_728 = local_628;
              do {
                if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                  lVar18 = local_728 * 2;
                  local_3b0 = (local_728 -
                              vStack_5b8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) *
                              CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                              CONCAT71(local_5c8._1_7_,local_5c8[0]) +
                              (local_4d0 - local_5a0) *
                              (long)vStack_5b8.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start * 8;
                  lVar20 = (long)local_6d8.begin.y;
                  local_6f8 = (undefined **)(local_6d8.p + (lVar18 - lVar20) * local_6d8.jstride);
                  lVar37 = (long)local_3a8.begin.y;
                  lVar23 = local_728 * 2 + -1;
                  lVar19 = local_728 * 2 + 1;
                  lVar34 = (lVar18 - lVar37) * local_3a8.jstride;
                  local_5d0 = local_3a8.p +
                              (((int)lVar18 - local_3a8.begin.y) + -2) * local_3a8.jstride;
                  local_5d8 = local_3a8.p + (lVar23 - lVar37) * local_3a8.jstride;
                  local_5e0 = local_3a8.p + (lVar19 - lVar37) * local_3a8.jstride;
                  local_5e8 = (undefined **)(local_6d8.p + (lVar23 - lVar20) * local_6d8.jstride);
                  local_5f0 = (undefined **)(local_6d8.p + (lVar19 - lVar20) * local_6d8.jstride);
                  lVar35 = (iVar33 - local_3a8.begin.z) * local_3a8.kstride;
                  lVar20 = (local_6e4 - local_3a8.begin.z) * local_3a8.kstride;
                  lVar37 = (local_6e8 - local_3a8.begin.z) * local_3a8.kstride;
                  lVar21 = (local_6ec - local_3a8.begin.z) * local_3a8.kstride;
                  local_5f8 = (iVar33 - local_6d8.begin.z) * local_6d8.kstride;
                  lVar19 = (local_6e8 - local_6d8.begin.z) * local_6d8.kstride;
                  local_608 = (local_6ec - local_6d8.begin.z) * local_6d8.kstride;
                  local_498 = local_4e8 + (lVar18 - local_4e0) * local_698.jstride * 4;
                  local_4a0 = local_3a8.nstride * 8;
                  local_4a8 = (long)(int)vStack_5b8.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_4b0 = (long)local_6d8.begin.x;
                  lVar18 = (long)local_3a8.begin.x;
                  local_4b8 = local_6f8 + local_5f8;
                  local_610 = local_5e8 + local_5f8;
                  local_618 = local_5f0 + local_5f8;
                  local_600 = local_3a8.nstride * 4;
                  local_4c0 = local_3a8.nstride * 6;
                  lVar23 = local_620;
                  do {
                    uVar38 = lVar23 * 2;
                    dVar53 = 0.0;
                    if (*(int *)(local_498 + (uVar38 - local_3b8) * 4) == 0) {
                      lVar26 = uVar38 - local_4b0;
                      lVar32 = (long)(((int)uVar38 - local_3a8.begin.x) + -2);
                      lVar29 = uVar38 - 1;
                      lVar22 = lVar29 - lVar18;
                      dVar53 = local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride];
                      if (((local_3a8.p[lVar34 + lVar32 + lVar35 + local_3a8.nstride] != 0.0) ||
                          (dVar53 != 0.0)) || (NAN(dVar53))) {
                        dVar53 = ((double)local_4b8[lVar29 - local_4b0] * ABS(dVar53)) /
                                 (ABS(local_3a8.p[lVar34 + lVar32 + lVar35 + local_3a8.nstride]) +
                                 ABS(dVar53));
                      }
                      else {
                        dVar53 = (double)local_4b8[lVar29 - local_4b0] * 0.5;
                      }
                      lVar36 = uVar38 - lVar18;
                      uVar38 = uVar38 | 1;
                      dVar54 = local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride];
                      dVar55 = (local_3a8.p + lVar34 + lVar36 + lVar35 + local_3a8.nstride)[1];
                      if (((dVar54 != 0.0) || (NAN(dVar54))) || ((dVar55 != 0.0 || (NAN(dVar55)))))
                      {
                        dVar54 = ((double)local_4b8[uVar38 - local_4b0] * ABS(dVar54)) /
                                 (ABS(dVar55) + ABS(dVar54));
                      }
                      else {
                        dVar54 = (double)local_4b8[uVar38 - local_4b0] * 0.5;
                      }
                      local_450 = local_5d0 + lVar36;
                      dVar55 = local_450[lVar35 + local_3a8.nstride * 2];
                      dVar56 = local_5d8[lVar36 + lVar35 + local_3a8.nstride * 2];
                      if (((dVar55 != 0.0) || (NAN(dVar55))) || ((dVar56 != 0.0 || (NAN(dVar56)))))
                      {
                        dVar55 = ((double)local_610[lVar26] * ABS(dVar56)) /
                                 (ABS(dVar55) + ABS(dVar56));
                      }
                      else {
                        dVar55 = (double)local_610[lVar26] * 0.5;
                      }
                      dVar56 = local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 2];
                      local_468 = local_5e0 + lVar36;
                      dVar57 = local_468[lVar35 + local_3a8.nstride * 2];
                      if ((((dVar56 != 0.0) || (NAN(dVar56))) || (dVar57 != 0.0)) || (NAN(dVar57)))
                      {
                        dVar56 = ((double)local_618[lVar26] * ABS(dVar56)) /
                                 (ABS(dVar56) + ABS(dVar57));
                      }
                      else {
                        dVar56 = (double)local_618[lVar26] * 0.5;
                      }
                      dVar57 = local_3a8.p[lVar34 + lVar36 + lVar20 + local_3a8.nstride * 3];
                      dVar58 = local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 3];
                      if (((dVar57 != 0.0) || (NAN(dVar57))) || ((dVar58 != 0.0 || (NAN(dVar58)))))
                      {
                        dVar57 = ((double)local_6f8[lVar26 + lVar19] * ABS(dVar58)) /
                                 (ABS(dVar57) + ABS(dVar58));
                      }
                      else {
                        dVar57 = (double)local_6f8[lVar26 + lVar19] * 0.5;
                      }
                      lVar31 = uVar38 - lVar18;
                      dVar58 = local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 3];
                      local_460 = local_3a8.p + lVar34 + lVar36 + lVar21;
                      dVar44 = local_460[local_3a8.nstride * 3];
                      if (((dVar58 != 0.0) || (NAN(dVar58))) || ((dVar44 != 0.0 || (NAN(dVar44)))))
                      {
                        dVar58 = ((double)local_6f8[lVar26 + local_608] * ABS(dVar58)) /
                                 (ABS(dVar58) + ABS(dVar44));
                      }
                      else {
                        dVar58 = (double)local_6f8[lVar26 + local_608] * 0.5;
                      }
                      local_410 = local_5d8 + lVar32 + lVar35;
                      local_3c8 = local_5d0 + lVar32;
                      local_400 = local_3c8 + lVar35;
                      dVar87 = ABS(local_400[local_3a8.nstride * 4]);
                      dVar59 = ABS(local_410[local_3a8.nstride * 4]);
                      local_418 = local_5d8 + lVar22 + lVar35;
                      local_408 = local_5d0 + lVar22 + lVar35;
                      dVar113 = ABS(local_408[local_3a8.nstride * 4]);
                      dVar96 = ABS(local_418[local_3a8.nstride * 4]);
                      dVar122 = ABS(local_408[local_3a8.nstride * 2]) / (dVar87 + dVar113 + 1e-100);
                      dVar130 = ABS(local_418[local_3a8.nstride * 2]) / (dVar59 + dVar96 + 1e-100);
                      dVar66 = ABS(local_410[local_3a8.nstride]) / (dVar87 + dVar59 + 1e-100) + 1.0;
                      dVar82 = ABS(local_418[local_3a8.nstride]) / (dVar113 + dVar96 + 1e-100) + 1.0
                      ;
                      dVar96 = (dVar82 + dVar130) * dVar96;
                      lVar29 = lVar29 - local_4b0;
                      local_3d0 = local_5e8 + lVar29;
                      dVar88 = ABS(local_450[lVar35 + local_3a8.nstride * 4]);
                      dVar44 = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride * 4]);
                      local_448 = local_5d8 + lVar31 + lVar35;
                      local_3e0 = local_5d0 + lVar31;
                      local_440 = local_3e0 + lVar35;
                      dVar123 = ABS(local_440[local_3a8.nstride * 4]);
                      dVar97 = ABS(local_448[local_3a8.nstride * 4]);
                      dVar114 = ABS(local_440[local_3a8.nstride * 2]) / (dVar88 + dVar123 + 1e-100);
                      dVar131 = ABS(local_448[local_3a8.nstride * 2]) / (dVar44 + dVar97 + 1e-100);
                      dVar67 = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride]) /
                               (dVar88 + dVar44 + 1e-100) + 1.0;
                      dVar83 = ABS(local_448[local_3a8.nstride]) / (dVar123 + dVar97 + 1e-100) + 1.0
                      ;
                      dVar44 = (dVar67 + dVar131) * dVar44;
                      lVar41 = uVar38 - local_4b0;
                      local_700 = local_5e8 + lVar41;
                      local_3f0 = local_5e0 + lVar32;
                      local_478 = local_3f0 + lVar35;
                      dVar98 = ABS(local_3a8.p[lVar34 + lVar32 + lVar35 + local_3a8.nstride * 4]);
                      dVar89 = ABS(local_478[local_3a8.nstride * 4]);
                      local_458 = local_5e0 + lVar22;
                      local_470 = local_458 + lVar35;
                      dVar124 = ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 4]);
                      dVar115 = ABS(local_470[local_3a8.nstride * 4]);
                      dVar60 = ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 2]) /
                               (dVar98 + dVar124 + 1e-100);
                      dVar132 = ABS(local_470[local_3a8.nstride * 2]) / (dVar89 + dVar115 + 1e-100);
                      dVar68 = ABS(local_478[local_3a8.nstride]) / (dVar98 + dVar89 + 1e-100) + 1.0;
                      dVar84 = ABS(local_470[local_3a8.nstride]) / (dVar124 + dVar115 + 1e-100) +
                               1.0;
                      dVar124 = (dVar60 + dVar84) * dVar124;
                      local_3d8 = local_5f0 + lVar29;
                      dVar45 = ABS(local_468[lVar35 + local_3a8.nstride * 4]);
                      dVar99 = ABS(local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 4]);
                      local_3f8 = local_5e0 + lVar31;
                      local_480 = local_3f8 + lVar35;
                      dVar116 = ABS(local_480[local_3a8.nstride * 4]);
                      dVar125 = ABS(local_3a8.p[lVar34 + lVar31 + lVar35 + local_3a8.nstride * 4]);
                      dVar90 = ABS(local_3a8.p[lVar34 + lVar31 + lVar35 + local_3a8.nstride * 2]) /
                               (dVar99 + dVar125 + 1e-100);
                      dVar133 = ABS(local_480[local_3a8.nstride * 2]) / (dVar45 + dVar116 + 1e-100);
                      dVar69 = ABS(local_468[lVar35 + local_3a8.nstride]) /
                               (dVar45 + dVar99 + 1e-100) + 1.0;
                      dVar99 = (dVar69 + dVar90) * dVar99;
                      dVar85 = ABS(local_480[local_3a8.nstride]) / (dVar116 + dVar125 + 1e-100) +
                               1.0;
                      local_3e8 = local_5f0 + lVar41;
                      local_430 = local_3a8.p + lVar34 + lVar32 + lVar37;
                      local_420 = local_3a8.p + lVar34 + lVar32 + lVar20;
                      dVar61 = ABS(local_420[local_3a8.nstride * 5]);
                      dVar70 = ABS(local_430[local_3a8.nstride * 5]);
                      local_428 = local_3a8.p + lVar34 + lVar22 + lVar37;
                      local_438 = local_3a8.p + lVar34 + lVar22 + lVar20;
                      dVar171 = ABS(local_438[local_3a8.nstride * 5]);
                      dVar162 = ABS(local_428[local_3a8.nstride * 5]);
                      dVar179 = ABS(local_438[local_3a8.nstride * 3]) / (dVar61 + dVar171 + 1e-100);
                      dVar184 = ABS(local_428[local_3a8.nstride * 3]) / (dVar70 + dVar162 + 1e-100);
                      dVar86 = ABS(local_430[local_3a8.nstride]) / (dVar61 + dVar70 + 1e-100) + 1.0;
                      local_488 = local_3a8.p + lVar34 + lVar32 + lVar21;
                      dVar46 = ABS(local_488[local_3a8.nstride * 5]);
                      uStack_540 = 0;
                      dVar146 = ABS(local_3a8.p[lVar34 + lVar32 + lVar35 + local_3a8.nstride * 5]);
                      local_490 = local_3a8.p + lVar34 + lVar22 + lVar21;
                      dVar62 = ABS(local_490[local_3a8.nstride * 5]);
                      uStack_550 = 0;
                      dVar47 = ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 5]);
                      dVar63 = ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 3]) /
                               (dVar146 + dVar47 + 1e-100);
                      dVar91 = ABS(local_488[local_3a8.nstride]) / (dVar46 + dVar146 + 1e-100) + 1.0
                      ;
                      local_368 = ABS(local_490[local_3a8.nstride]) / (dVar62 + dVar47 + 1e-100) +
                                  1.0;
                      uStack_360 = 0;
                      dVar47 = (dVar63 + local_368) * dVar47;
                      dVar140 = ABS(local_428[local_3a8.nstride]) / (dVar171 + dVar162 + 1e-100) +
                                1.0;
                      dVar162 = (dVar140 + dVar184) * dVar162;
                      dVar100 = ABS(local_3a8.p[lVar34 + lVar36 + lVar20 + local_3a8.nstride * 5]);
                      dVar48 = ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 5]);
                      local_708 = local_3a8.p + lVar34 + lVar31 + lVar37;
                      local_710 = local_3a8.p + lVar34 + lVar31 + lVar20;
                      dVar141 = ABS(local_710[local_3a8.nstride * 5]);
                      local_358 = ABS(local_708[local_3a8.nstride * 5]);
                      uStack_350 = 0;
                      dVar185 = ABS(local_710[local_3a8.nstride * 3]) / (dVar100 + dVar141 + 1e-100)
                      ;
                      dVar71 = ABS(local_708[local_3a8.nstride * 3]) / (dVar48 + local_358 + 1e-100)
                      ;
                      dVar163 = ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride]) /
                                (dVar100 + dVar48 + 1e-100) + 1.0;
                      dVar172 = ABS(local_708[local_3a8.nstride]) / (dVar141 + local_358 + 1e-100) +
                                1.0;
                      dVar48 = (dVar163 + dVar71) * dVar48;
                      dVar101 = ABS(local_490[local_3a8.nstride * 3]) / (dVar46 + dVar62 + 1e-100);
                      dVar92 = ABS(local_460[local_3a8.nstride * 5]);
                      dVar49 = ABS(local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 5]);
                      dVar117 = ABS(local_3a8.p[lVar34 + lVar31 + lVar21 + local_3a8.nstride * 5]);
                      dVar134 = ABS(local_3a8.p[lVar34 + lVar31 + lVar35 + local_3a8.nstride * 5]);
                      dVar147 = ABS(local_3a8.p[lVar34 + lVar31 + lVar35 + local_3a8.nstride * 3]) /
                                (dVar49 + dVar134 + 1e-100);
                      dVar164 = ABS(local_3a8.p[lVar34 + lVar31 + lVar21 + local_3a8.nstride * 3]) /
                                (dVar92 + dVar117 + 1e-100);
                      dVar72 = ABS(local_460[local_3a8.nstride]) / (dVar92 + dVar49 + 1e-100) + 1.0;
                      dVar49 = (dVar72 + dVar147) * dVar49;
                      dVar102 = ABS(local_3a8.p[lVar34 + lVar31 + lVar21 + local_3a8.nstride]) /
                                (dVar117 + dVar134 + 1e-100) + 1.0;
                      local_548 = local_450 + lVar37;
                      dVar148 = ABS(local_548[local_3a8.nstride * 6]);
                      dVar73 = ABS(local_468[lVar37 + local_3a8.nstride * 6]);
                      local_718 = local_450 + lVar20;
                      dVar103 = ABS(local_718[local_3a8.nstride * 6]);
                      dVar112 = ABS(local_3a8.p[lVar34 + lVar36 + lVar20 + local_3a8.nstride * 6]);
                      dVar50 = ABS(local_548[local_3a8.nstride * 2]) / (dVar103 + dVar148 + 1e-100)
                               + 1.0;
                      local_558 = local_5d8 + lVar36 + lVar37;
                      dVar118 = ABS(local_558[local_3a8.nstride * 6]);
                      dVar121 = ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 6]);
                      auVar93._0_8_ = ABS(local_558[local_3a8.nstride * 3]);
                      auVar93._8_8_ = ABS(local_468[lVar37 + local_3a8.nstride * 3]);
                      auVar166._0_8_ = dVar118 + dVar148 + 1e-100;
                      auVar166._8_8_ = dVar73 + dVar121 + 1e-100;
                      auVar94 = divpd(auVar93,auVar166);
                      auVar150._0_8_ = ABS(local_558[local_3a8.nstride * 2]);
                      auVar150._8_8_ =
                           ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 2]);
                      local_720 = local_5d8 + lVar36 + lVar20;
                      dVar165 = ABS(local_720[local_3a8.nstride * 6]);
                      dVar170 = ABS(local_468[lVar20 + local_3a8.nstride * 6]);
                      auVar180._0_8_ = dVar165 + dVar118 + 1e-100;
                      auVar180._8_8_ = dVar121 + dVar112 + 1e-100;
                      auVar151 = divpd(auVar150,auVar180);
                      auVar173._0_8_ = ABS(local_720[local_3a8.nstride * 3]);
                      auVar173._8_8_ = ABS(local_468[lVar20 + local_3a8.nstride * 3]);
                      auVar181._0_8_ = dVar103 + dVar165 + 1e-100;
                      auVar181._8_8_ = dVar112 + dVar170 + 1e-100;
                      auVar174 = divpd(auVar173,auVar181);
                      dVar149 = auVar151._0_8_ + 1.0;
                      dVar161 = auVar151._8_8_ + 1.0;
                      dVar64 = ABS(local_468[lVar37 + local_3a8.nstride * 2]) /
                               (dVar170 + dVar73 + 1e-100) + 1.0;
                      dVar118 = (auVar94._0_8_ + dVar149) * dVar118;
                      dVar121 = (auVar94._8_8_ + dVar161) * dVar121;
                      auVar151._0_8_ = (double)local_5e8[lVar26 + lVar19] * dVar118;
                      auVar151._8_8_ = (double)local_5f0[lVar26 + lVar19] * dVar121;
                      auVar104._0_8_ =
                           dVar118 + (dVar50 + auVar94._0_8_) * dVar148 +
                                     (dVar149 + auVar174._0_8_) * dVar165 +
                                     (dVar50 + auVar174._0_8_) * dVar103 + 1e-100;
                      auVar104._8_8_ =
                           (auVar94._8_8_ + dVar64) * dVar73 +
                           dVar121 + (dVar64 + auVar174._8_8_) * dVar170 +
                                     (dVar161 + auVar174._8_8_) * dVar112 + 1e-100;
                      auVar94 = divpd(auVar151,auVar104);
                      dVar50 = ABS(local_450[lVar35 + local_3a8.nstride * 6]);
                      dVar112 = ABS(local_468[lVar35 + local_3a8.nstride * 6]);
                      dVar103 = ABS(local_450[lVar21 + local_3a8.nstride * 6]);
                      dVar118 = ABS(local_460[local_3a8.nstride * 6]);
                      dVar170 = ABS(local_450[lVar21 + local_3a8.nstride * 2]) /
                                (dVar103 + dVar50 + 1e-100) + 1.0;
                      dVar64 = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride * 6]);
                      dVar73 = ABS(local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 6]);
                      auVar152._0_8_ = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride * 3]);
                      auVar152._8_8_ = ABS(local_468[lVar35 + local_3a8.nstride * 3]);
                      auVar105._0_8_ = dVar64 + dVar50 + 1e-100;
                      auVar105._8_8_ = dVar112 + dVar73 + 1e-100;
                      auVar153 = divpd(auVar152,auVar105);
                      auVar119._0_8_ = ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride * 2]);
                      auVar119._8_8_ = ABS(local_460[local_3a8.nstride * 2]);
                      dVar149 = ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride * 6]);
                      dVar161 = ABS(local_468[lVar21 + local_3a8.nstride * 6]);
                      auVar127._0_8_ = dVar149 + dVar64 + 1e-100;
                      auVar127._8_8_ = dVar73 + dVar118 + 1e-100;
                      auVar174 = divpd(auVar119,auVar127);
                      local_538 = local_468[lVar21 + local_3a8.nstride * 7];
                      uStack_530 = 0;
                      auVar129._0_8_ = ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride * 3]);
                      auVar129._8_8_ = ABS(local_468[lVar21 + local_3a8.nstride * 3]);
                      auVar167._0_8_ = dVar103 + dVar149 + 1e-100;
                      auVar167._8_8_ = dVar161 + dVar118 + 1e-100;
                      auVar151 = divpd(auVar129,auVar167);
                      dVar121 = auVar174._0_8_ + 1.0;
                      dVar148 = auVar174._8_8_ + 1.0;
                      dVar64 = (auVar153._0_8_ + dVar121) * dVar64;
                      dVar73 = (auVar153._8_8_ + dVar148) * dVar73;
                      dVar165 = ABS(local_468[lVar21 + local_3a8.nstride * 2]) /
                                (dVar161 + dVar112 + 1e-100) + 1.0;
                      local_768 = local_478[local_3a8.nstride * 7];
                      uStack_760 = 0;
                      auVar174._0_8_ =
                           dVar64 + (dVar170 + auVar153._0_8_) * dVar50 +
                           (dVar170 + auVar151._0_8_) * dVar103 +
                           (dVar121 + auVar151._0_8_) * dVar149 + 1e-100;
                      auVar174._8_8_ =
                           (auVar153._8_8_ + dVar165) * dVar112 + dVar73 +
                           (dVar148 + auVar151._8_8_) * dVar118 +
                           (dVar165 + auVar151._8_8_) * dVar161 + 1e-100;
                      auVar155._8_8_ = (double)local_5f0[lVar26 + local_608] * dVar73;
                      auVar155._0_8_ = (double)local_5e8[lVar26 + local_608] * dVar64;
                      auVar151 = divpd(auVar155,auVar174);
                      dStack_7b0 = auVar151._8_8_;
                      local_7b8 = dStack_7b0 +
                                  auVar94._8_8_ +
                                  ((double)local_6f8[lVar41 + local_608] * dVar49) /
                                  ((dVar147 + dVar102) * dVar134 + dVar49 +
                                   (dVar72 + dVar164) * dVar92 + (dVar102 + dVar164) * dVar117 +
                                  1e-100) + (dVar47 * (double)local_6f8[lVar29 + local_608]) /
                                            ((dVar91 + dVar63) * dVar146 + dVar47 +
                                             (dVar91 + dVar101) * dVar46 +
                                             (local_368 + dVar101) * dVar62 + 1e-100) +
                                            ((double)local_6f8[lVar41 + lVar19] * dVar48) /
                                            (dVar48 + (dVar185 + dVar172) * dVar141 +
                                                      (dVar163 + dVar185) * dVar100 +
                                             (dVar172 + dVar71) * local_358 + 1e-100) +
                                            ((double)local_6f8[lVar29 + lVar19] * dVar162) /
                                            (dVar162 + (dVar86 + dVar184) * dVar70 +
                                                       (dVar179 + dVar140) * dVar171 +
                                                       (dVar86 + dVar179) * dVar61 + 1e-100) +
                                            ((double)local_3e8[local_5f8] * dVar99) /
                                            ((dVar90 + dVar85) * dVar125 + dVar99 +
                                             (dVar69 + dVar133) * dVar45 +
                                             (dVar85 + dVar133) * dVar116 + 1e-100) +
                                            (dVar124 * (double)local_3d8[local_5f8]) /
                                            ((dVar68 + dVar60) * dVar98 + dVar124 +
                                             (dVar68 + dVar132) * dVar89 +
                                             (dVar84 + dVar132) * dVar115 + 1e-100) +
                                            ((double)local_700[local_5f8] * dVar44) /
                                            (dVar44 + (dVar114 + dVar83) * dVar123 +
                                                      (dVar67 + dVar114) * dVar88 +
                                             (dVar83 + dVar131) * dVar97 + 1e-100) +
                                            ((double)local_3d0[local_5f8] * dVar96) /
                                            (dVar96 + (dVar66 + dVar130) * dVar59 +
                                                      (dVar122 + dVar82) * dVar113 +
                                                      (dVar66 + dVar122) * dVar87 + 1e-100) +
                                            (double)local_6f8[lVar26 + local_5f8] + dVar53 + dVar54
                                            + dVar55 + dVar56 + dVar57 + dVar58 + auVar94._0_8_ +
                                  auVar151._0_8_;
                      dVar58 = ABS(local_3a8.p[lVar34 + lVar36 + lVar35 + local_3a8.nstride * 7]);
                      dVar73 = ABS(local_460[local_3a8.nstride * 7]);
                      auVar153._8_4_ = SUB84(dVar58,0);
                      auVar153._0_8_ = dVar58;
                      auVar153._12_4_ = (int)((ulong)dVar58 >> 0x20);
                      dVar53 = dVar58 + ABS(local_3a8.p
                                            [lVar34 + lVar31 + lVar35 + local_3a8.nstride * 7]);
                      dVar55 = auVar153._8_8_ + ABS(local_468[lVar35 + local_3a8.nstride * 7]);
                      local_568 = local_490[local_3a8.nstride * 4];
                      uStack_560 = 0;
                      local_748 = local_450[lVar21 + local_3a8.nstride * 7];
                      uStack_740 = 0;
                      auVar154._0_8_ =
                           ABS(local_3a8.p[lVar34 + lVar31 + lVar35 + local_3a8.nstride * 6]);
                      auVar154._8_8_ = ABS(local_468[lVar35 + local_3a8.nstride * 5]);
                      auVar79._0_8_ = dVar53 + 1e-100;
                      auVar79._8_8_ = dVar55 + 1e-100;
                      auVar155 = divpd(auVar154,auVar79);
                      local_758 = ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 7])
                      ;
                      dVar57 = ABS(local_490[local_3a8.nstride * 7]);
                      auVar144._8_4_ = SUB84(local_758,0);
                      auVar144._0_8_ = local_758;
                      auVar144._12_4_ = (int)((ulong)local_758 >> 0x20);
                      dVar54 = local_758 +
                               ABS(local_3a8.p[lVar34 + lVar32 + lVar35 + local_3a8.nstride * 7]);
                      dVar56 = auVar144._8_8_ + ABS(local_470[local_3a8.nstride * 7]);
                      local_7c8 = local_5d0[lVar22 + lVar21 + local_3a8.nstride * 7];
                      uStack_7c0 = 0;
                      auVar142._0_8_ =
                           ABS(local_3a8.p[lVar34 + lVar22 + lVar35 + local_3a8.nstride * 6]);
                      auVar142._8_8_ = ABS(local_470[local_3a8.nstride * 5]);
                      auVar157._0_8_ = dVar54 + 1e-100;
                      auVar157._8_8_ = dVar56 + 1e-100;
                      auVar94 = divpd(auVar142,auVar157);
                      dStack_750 = auVar94._8_8_;
                      local_758 = (dStack_750 +
                                   ABS(local_470[local_3a8.nstride * 3]) /
                                   (ABS(local_470[local_3a8.nstride * 7]) + ABS(local_768) + dVar54
                                   + 1e-100) +
                                   ABS(local_490[local_3a8.nstride * 2]) /
                                   (ABS(local_488[local_3a8.nstride * 7]) + dVar54 + dVar57 + 1e-100
                                   ) + ABS(local_458[lVar21 + local_3a8.nstride]) /
                                       (dVar56 + dVar57 +
                                        ABS(local_458[lVar21 + local_3a8.nstride * 7]) + 1e-100) +
                                       1.0 + ABS(local_568) / (local_758 + dVar57 + 1e-100) +
                                  auVar94._0_8_) * local_758;
                      dVar60 = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride * 7]);
                      dVar59 = ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride * 7]);
                      dVar44 = ABS(local_448[local_3a8.nstride * 7]) + dVar60;
                      dVar45 = dVar60 + ABS(local_450[lVar35 + local_3a8.nstride * 7]);
                      auVar126._0_8_ = ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride * 4]);
                      auVar126._8_8_ = ABS(local_448[local_3a8.nstride * 3]);
                      auVar106._0_8_ = dVar60 + dVar59 + 1e-100;
                      auVar106._8_8_ =
                           ABS(local_450[lVar35 + local_3a8.nstride * 7]) +
                           ABS(local_440[local_3a8.nstride * 7]) + dVar60 +
                           ABS(local_448[local_3a8.nstride * 7]) + 1e-100;
                      auVar127 = divpd(auVar126,auVar106);
                      auVar156._0_8_ = ABS(local_448[local_3a8.nstride * 6]);
                      auVar156._8_8_ = ABS(local_5d8[lVar36 + lVar35 + local_3a8.nstride * 5]);
                      auVar176._0_8_ = dVar44 + 1e-100;
                      auVar176._8_8_ = dVar45 + 1e-100;
                      auVar157 = divpd(auVar156,auVar176);
                      dVar56 = ABS(local_418[local_3a8.nstride * 7]);
                      dVar124 = ABS(local_410[local_3a8.nstride * 7]) + dVar56;
                      dVar61 = dVar56 + ABS(local_408[local_3a8.nstride * 7]);
                      dVar46 = ABS(local_5d8[lVar22 + lVar21 + local_3a8.nstride * 7]);
                      auVar81._8_4_ = SUB84(dVar56,0);
                      auVar81._0_8_ = dVar56;
                      auVar81._12_4_ = (int)((ulong)dVar56 >> 0x20);
                      auVar175._0_8_ = ABS(local_5d8[lVar22 + lVar21 + local_3a8.nstride * 4]);
                      auVar175._8_8_ = ABS(local_418[local_3a8.nstride * 3]);
                      auVar107._0_8_ = dVar46 + dVar56 + 1e-100;
                      auVar107._8_8_ =
                           ABS(local_408[local_3a8.nstride * 7]) +
                           ABS(local_400[local_3a8.nstride * 7]) +
                           ABS(local_410[local_3a8.nstride * 7]) + auVar81._8_8_ + 1e-100;
                      auVar176 = divpd(auVar175,auVar107);
                      auVar143._0_8_ = ABS(local_418[local_3a8.nstride * 6]);
                      auVar143._8_8_ = ABS(local_418[local_3a8.nstride * 5]);
                      auVar94._8_8_ = dVar61 + 1e-100;
                      auVar94._0_8_ = dVar124 + 1e-100;
                      auVar144 = divpd(auVar143,auVar94);
                      dVar47 = ABS(local_3a8.p[lVar34 + lVar36 + lVar20 + local_3a8.nstride * 7]);
                      dVar54 = ABS(local_468[lVar37 + local_3a8.nstride * 7]);
                      dVar48 = ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 7]);
                      auVar109._0_8_ = ABS(local_708[local_3a8.nstride * 2]);
                      auVar109._8_8_ = ABS(local_468[lVar37 + local_3a8.nstride]);
                      auVar177._8_4_ = SUB84(dVar47,0);
                      auVar177._0_8_ = dVar47;
                      auVar177._12_4_ = (int)((ulong)dVar47 >> 0x20);
                      auVar74._8_4_ = SUB84(dVar48,0);
                      auVar74._0_8_ = dVar48;
                      auVar74._12_4_ = (int)((ulong)dVar48 >> 0x20);
                      auVar178._0_8_ =
                           dVar47 + ABS(local_710[local_3a8.nstride * 7]) + dVar48 +
                           ABS(local_708[local_3a8.nstride * 7]) + 1e-100;
                      auVar178._8_8_ =
                           auVar177._8_8_ + ABS(local_468[lVar20 + local_3a8.nstride * 7]) +
                           auVar74._8_8_ + dVar54 + 1e-100;
                      auVar94 = divpd(auVar109,auVar178);
                      auVar128._0_8_ =
                           ABS(local_3a8.p[lVar34 + lVar36 + lVar37 + local_3a8.nstride * 4]);
                      auVar128._8_8_ = ABS(local_3f8[lVar37 + local_3a8.nstride * 3]);
                      dVar57 = dVar48 + ABS(local_708[local_3a8.nstride * 7]);
                      auVar135._0_8_ = dVar47 + dVar48 + 1e-100;
                      auVar135._8_8_ =
                           dVar54 + dVar57 + ABS(local_3f8[lVar37 + local_3a8.nstride * 7]) + 1e-100
                      ;
                      auVar129 = divpd(auVar128,auVar135);
                      auVar108._0_8_ = ABS(local_708[local_3a8.nstride * 6]);
                      auVar108._8_8_ = ABS(local_468[lVar37 + local_3a8.nstride * 5]);
                      auVar75._0_8_ = dVar57 + 1e-100;
                      auVar75._8_8_ = auVar74._8_8_ + dVar54 + 1e-100;
                      auVar109 = divpd(auVar108,auVar75);
                      dVar47 = ABS(local_438[local_3a8.nstride * 7]);
                      dVar64 = ABS(local_428[local_3a8.nstride * 7]);
                      dVar57 = ABS(local_458[lVar37 + local_3a8.nstride * 7]);
                      auVar137._8_4_ = SUB84(dVar47,0);
                      auVar137._0_8_ = dVar47;
                      auVar137._12_4_ = (int)((ulong)dVar47 >> 0x20);
                      auVar183._0_8_ = ABS(local_458[lVar37 + local_3a8.nstride]);
                      auVar183._8_8_ = ABS(local_428[local_3a8.nstride * 2]);
                      auVar160._0_8_ =
                           dVar57 + dVar64 + dVar47 + ABS(local_458[lVar20 + local_3a8.nstride * 7])
                           + 1e-100;
                      auVar160._8_8_ =
                           dVar64 + ABS(local_430[local_3a8.nstride * 7]) +
                                    auVar137._8_8_ + ABS(local_420[local_3a8.nstride * 7]) + 1e-100;
                      auVar174 = divpd(auVar183,auVar160);
                      auVar169._8_4_ = SUB84(dVar64,0);
                      auVar169._0_8_ = dVar64;
                      auVar169._12_4_ = (int)((ulong)dVar64 >> 0x20);
                      dVar54 = dVar64 + ABS(local_430[local_3a8.nstride * 7]);
                      auVar182._0_8_ = ABS(local_428[local_3a8.nstride * 4]);
                      auVar182._8_8_ = ABS(local_458[lVar37 + local_3a8.nstride * 3]);
                      auVar158._0_8_ = dVar64 + dVar47 + 1e-100;
                      auVar158._8_8_ =
                           ABS(local_3f0[lVar37 + local_3a8.nstride * 7]) + dVar54 + dVar57 + 1e-100
                      ;
                      auVar183 = divpd(auVar182,auVar158);
                      auVar136._0_8_ = ABS(local_428[local_3a8.nstride * 6]);
                      auVar136._8_8_ = ABS(local_458[lVar37 + local_3a8.nstride * 5]);
                      auVar51._0_8_ = dVar54 + 1e-100;
                      auVar51._8_8_ = auVar169._8_8_ + dVar57 + 1e-100;
                      auVar137 = divpd(auVar136,auVar51);
                      dVar49 = ABS(local_558[local_3a8.nstride * 7]);
                      dVar47 = ABS(local_548[local_3a8.nstride * 7]);
                      dVar54 = ABS(local_720[local_3a8.nstride * 7]);
                      dVar57 = ABS(local_5d8[lVar31 + lVar37 + local_3a8.nstride * 7]);
                      auVar138._8_4_ = SUB84(dVar54,0);
                      auVar138._0_8_ = dVar54;
                      auVar138._12_4_ = (int)((ulong)dVar54 >> 0x20);
                      auVar159._0_8_ = ABS(local_5d8[lVar31 + lVar37 + local_3a8.nstride * 2]);
                      auVar159._8_8_ = ABS(local_558[local_3a8.nstride]);
                      auVar139._0_8_ =
                           dVar54 + ABS(local_5d8[lVar31 + lVar20 + local_3a8.nstride * 7]) + dVar49
                           + dVar57 + 1e-100;
                      auVar139._8_8_ =
                           auVar138._8_8_ + ABS(local_718[local_3a8.nstride * 7]) + dVar47 + dVar49
                           + 1e-100;
                      auVar160 = divpd(auVar159,auVar139);
                      auVar65._0_8_ = ABS(local_558[local_3a8.nstride * 4]);
                      auVar65._8_8_ = ABS(local_5d8[lVar31 + lVar37 + local_3a8.nstride * 3]);
                      auVar145._0_8_ = dVar49 + dVar54 + 1e-100;
                      auVar145._8_8_ =
                           dVar47 + ABS(local_3e0[lVar37 + local_3a8.nstride * 7]) + dVar49 + dVar57
                           + 1e-100;
                      auVar153 = divpd(auVar65,auVar145);
                      auVar168._0_8_ = ABS(local_5d8[lVar31 + lVar37 + local_3a8.nstride * 6]);
                      auVar168._8_8_ = ABS(local_558[local_3a8.nstride * 5]);
                      auVar110._0_8_ = dVar57 + dVar49 + 1e-100;
                      auVar110._8_8_ = dVar49 + dVar47 + 1e-100;
                      auVar169 = divpd(auVar168,auVar110);
                      dVar50 = ABS(local_5d8[lVar22 + lVar20 + local_3a8.nstride * 7]);
                      dVar47 = ABS(local_5d8[lVar32 + lVar37 + local_3a8.nstride * 7]);
                      dVar54 = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 7]);
                      dVar57 = ABS(local_5d0[lVar22 + lVar37 + local_3a8.nstride * 7]);
                      auVar52._0_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride]);
                      auVar52._8_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 2]);
                      auVar76._8_4_ = SUB84(dVar50,0);
                      auVar76._0_8_ = dVar50;
                      auVar76._12_4_ = (int)((ulong)dVar50 >> 0x20);
                      auVar77._8_4_ = SUB84(dVar54,0);
                      auVar77._0_8_ = dVar54;
                      auVar77._12_4_ = (int)((ulong)dVar54 >> 0x20);
                      auVar95._0_8_ =
                           dVar57 + dVar50 + ABS(local_5d0[lVar22 + lVar20 + local_3a8.nstride * 7])
                           + dVar54 + 1e-100;
                      auVar95._8_8_ =
                           dVar47 + auVar76._8_8_ +
                                    ABS(local_5d8[lVar32 + lVar20 + local_3a8.nstride * 7]) +
                           auVar77._8_8_ + 1e-100;
                      auVar151 = divpd(auVar52,auVar95);
                      auVar78._0_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 4]);
                      auVar78._8_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 3]);
                      auVar120._0_8_ = dVar50 + dVar54 + 1e-100;
                      auVar120._8_8_ =
                           dVar57 + ABS(local_3c8[lVar37 + local_3a8.nstride * 7]) + dVar47 +
                           auVar77._8_8_ + 1e-100;
                      auVar79 = divpd(auVar78,auVar120);
                      auVar80._0_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 6]);
                      auVar80._8_8_ = ABS(local_5d8[lVar22 + lVar37 + local_3a8.nstride * 5]);
                      auVar111._0_8_ = dVar47 + dVar54 + 1e-100;
                      auVar111._8_8_ = dVar54 + dVar57 + 1e-100;
                      auVar81 = divpd(auVar80,auVar111);
                      dVar53 = ((auVar81._8_8_ +
                                 auVar79._8_8_ + auVar151._8_8_ + auVar151._0_8_ + 1.0 +
                                 auVar79._0_8_ + auVar81._0_8_) * dVar54 * (double)local_3d0[lVar19]
                                * local_5d8[lVar22 + lVar37 + local_3a8.nstride * 8] +
                               (auVar169._8_8_ +
                                auVar153._8_8_ + auVar160._8_8_ + 1.0 + auVar160._0_8_ +
                                auVar153._0_8_ + auVar169._0_8_) * dVar49 *
                               (double)local_700[lVar19] *
                               local_5d8[lVar31 + lVar37 + local_3a8.nstride * 8] +
                               (auVar137._8_8_ +
                                auVar183._8_8_ + auVar174._8_8_ + auVar174._0_8_ + 1.0 +
                                auVar183._0_8_ + auVar137._0_8_) * dVar64 *
                               (double)local_3d8[lVar19] * local_458[lVar37 + local_3a8.nstride * 8]
                               + (auVar109._8_8_ +
                                  auVar129._8_8_ + auVar94._8_8_ + 1.0 + auVar94._0_8_ +
                                  auVar129._0_8_ + auVar109._0_8_) * dVar48 *
                                 (double)local_3e8[lVar19] *
                                 local_3f8[lVar37 + local_3a8.nstride * 8] +
                                 (auVar144._8_8_ +
                                  auVar176._8_8_ +
                                  ABS(local_5d8[lVar22 + lVar21 + local_3a8.nstride * 2]) /
                                  (ABS(local_5d8[lVar32 + lVar21 + local_3a8.nstride * 7]) + dVar124
                                   + dVar46 + 1e-100) +
                                  ABS(local_5d8[lVar22 + lVar21 + local_3a8.nstride]) /
                                  (dVar61 + ABS(local_7c8) + dVar46 + 1e-100) + 1.0 + auVar176._0_8_
                                 + auVar144._0_8_) * dVar56 * (double)local_3d0[local_608] *
                                 local_5d8[lVar22 + lVar21 + local_3a8.nstride * 8] +
                                 (auVar157._8_8_ +
                                  auVar127._8_8_ +
                                  ABS(local_5d8[lVar31 + lVar21 + local_3a8.nstride * 2]) /
                                  (dVar59 + dVar44 +
                                   ABS(local_5d8[lVar31 + lVar21 + local_3a8.nstride * 7]) + 1e-100)
                                  + ABS(local_5d8[lVar36 + lVar21 + local_3a8.nstride]) /
                                    (dVar45 + ABS(local_748) + dVar59 + 1e-100) + 1.0 +
                                  auVar127._0_8_ + auVar157._0_8_) * dVar60 *
                                 (double)local_700[local_608] *
                                 local_5d8[lVar31 + lVar21 + local_3a8.nstride * 8] +
                                 local_758 * (double)local_3d8[local_608] *
                                 local_458[lVar21 + local_3a8.nstride * 8] +
                                 (auVar155._8_8_ +
                                  ABS(local_480[local_3a8.nstride * 3]) /
                                  (ABS(local_468[lVar35 + local_3a8.nstride * 7]) + dVar53 +
                                   ABS(local_480[local_3a8.nstride * 7]) + 1e-100) +
                                  ABS(local_3a8.p[lVar34 + lVar31 + lVar21 + local_3a8.nstride * 2])
                                  / (dVar73 + dVar53 +
                                     ABS(local_3a8.p
                                         [lVar34 + lVar31 + lVar21 + local_3a8.nstride * 7]) +
                                    1e-100) +
                                  ABS(local_468[lVar21 + local_3a8.nstride]) /
                                  (dVar55 + dVar73 + ABS(local_538) + 1e-100) + 1.0 +
                                  ABS(local_460[local_3a8.nstride * 4]) / (dVar58 + dVar73 + 1e-100)
                                 + auVar155._0_8_) * dVar58 * (double)local_3e8[local_608] *
                                 local_3f8[lVar21 + local_3a8.nstride * 8] + local_7b8) * 0.125;
                      local_3c0 = lVar23;
                    }
                    *(double *)(local_3b0 + (lVar23 - local_4a8) * 8) = dVar53;
                    lVar23 = lVar23 + 1;
                  } while (local_6dc != (int)lVar23);
                }
                local_728 = local_728 + 1;
              } while (local_6e0 != (int)local_728);
            }
            uVar13 = (uint)local_730 + 1;
            bVar43 = (uint)local_730 != local_7e4.bigend.vect[2];
            local_730 = (ulong)uVar13;
          } while (bVar43);
        }
      }
      MFIter::operator++((MFIter *)&local_348);
    } while (local_348.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[0] <
             local_348.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.m_loshft.vect[2]);
  }
  MFIter::~MFIter((MFIter *)&local_348);
  local_5c8._1_7_ = 0;
  local_5c8[0] = true;
  local_5c8._8_4_ = 0;
  local_5c8._12_4_ = 0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6d8.p = (double *)&PTR__FabFactory_0080b918;
  MultiFab::MultiFab((MultiFab *)&local_348,
                     &(((FabArray<amrex::FArrayBox> *)&local_738->super_FabArrayBase)->
                      super_FabArrayBase).boxarray,
                     &(((FabArray<amrex::FArrayBox> *)&local_738->super_FabArrayBase)->
                      super_FabArrayBase).distributionMap,1,0,(MFInfo *)local_5c8,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_5b8);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&local_348,0.0,0,local_348.super_FabArrayBase.n_comp,
             &local_348.super_FabArrayBase.n_grow);
  PVar186 = Geometry::periodicity(local_518);
  local_5c8[0] = PVar186.period.vect[0]._0_1_;
  local_5c8._1_7_ = PVar186.period.vect._1_7_;
  local_5c8._8_4_ = PVar186.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&local_348,(FabArray<amrex::FArrayBox> *)local_1b0,(Periodicity *)local_5c8,COPY);
  this_01.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
       (local_798->super_MLNodeLinOp).m_nd_fine_mask.
       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[local_520]._M_t.
       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
  _Var8.super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>.
  super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>._M_head_impl =
       (local_798->super_MLNodeLinOp).m_has_fine_bndry.
       super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[local_520]._M_t.
       super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>;
  local_1c4.num_streams = Gpu::Device::max_gpu_streams;
  local_1c4.do_tiling = true;
  local_1c4.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_1c4.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_1c4.tilesize.vect[2] = DAT_00810ec0;
  local_1c4.dynamic = true;
  local_1c4.device_sync = true;
  MFIter::MFIter((MFIter *)local_5c8,&local_738->super_FabArrayBase,&local_1c4);
  if ((int)vStack_5b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < local_5a0) {
    do {
      iVar24 = (int)vStack_5b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (local_588 != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar24 = (local_588->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(int)vStack_5b8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage];
      }
      if (*(int *)(*(long *)((long)_Var8.
                                   super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_amrex::LayoutData<int>_*,_std::default_delete<amrex::LayoutData<int>_>_>
                                   .super__Head_base<0UL,_amrex::LayoutData<int>_*,_false>.
                                   _M_head_impl + 0xf0) + (long)iVar24 * 4) != 0) {
        MFIter::tilebox(&local_7e4,(MFIter *)local_5c8);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_6d8,local_738,(MFIter *)local_5c8);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_698,&local_348,(MFIter *)local_5c8);
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  ((Array4<const_int> *)&local_3a8,
                   (FabArray<amrex::IArrayBox> *)
                   this_01.
                   super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                   .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                   (MFIter *)local_5c8);
        if (local_7e4.smallend.vect[2] <= local_7e4.bigend.vect[2]) {
          local_780 = (ulong)(uint)local_7e4.bigend.vect[1];
          lVar23 = (long)local_7e4.smallend.vect[0];
          local_788 = lVar23 * 4;
          local_778 = lVar23 * 8;
          uVar13 = local_7e4.smallend.vect[2];
          do {
            if (local_7e4.smallend.vect[1] <= local_7e4.bigend.vect[1]) {
              local_770 = (long)(int)uVar13;
              lVar18 = (long)local_3a8.p +
                       ((long)local_7e4.smallend.vect[1] - (long)local_3a8.begin.y) *
                       local_3a8.jstride * 4 +
                       (local_770 - local_3a8.begin.z) * local_3a8.kstride * 4 +
                       (long)local_3a8.begin.x * -4 + local_788;
              lVar19 = (long)local_7e4.smallend.vect[1];
              do {
                if (local_7e4.smallend.vect[0] <= local_7e4.bigend.vect[0]) {
                  lVar20 = 0;
                  do {
                    if (*(int *)(lVar18 + lVar20 * 4) == 2) {
                      local_6d8.p
                      [lVar23 + (((lVar19 - local_6d8.begin.y) * local_6d8.jstride +
                                 (local_770 - local_6d8.begin.z) * local_6d8.kstride + lVar20) -
                                (long)local_6d8.begin.x)] =
                           (double)local_698.p
                                   [lVar23 + (((lVar19 - local_698.begin.y) * local_698.jstride +
                                              (local_770 - local_698.begin.z) * local_698.kstride +
                                              lVar20) - (long)local_698.begin.x)];
                    }
                    lVar20 = lVar20 + 1;
                  } while ((local_7e4.bigend.vect[0] - local_7e4.smallend.vect[0]) + 1 !=
                           (int)lVar20);
                }
                lVar19 = lVar19 + 1;
                lVar18 = lVar18 + local_3a8.jstride * 4;
              } while (local_7e4.bigend.vect[1] + 1U != (int)lVar19);
            }
            bVar43 = uVar13 != local_7e4.bigend.vect[2];
            uVar13 = uVar13 + 1;
          } while (bVar43);
        }
      }
      MFIter::operator++((MFIter *)local_5c8);
    } while ((int)vStack_5b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage < local_5a0);
  }
  MFIter::~MFIter((MFIter *)local_5c8);
  MultiFab::~MultiFab((MultiFab *)&local_348);
  MultiFab::~MultiFab((MultiFab *)local_1b0);
  if (local_7a0 != (FabArray<amrex::FArrayBox> *)0x0) {
    (*(((FabArray<amrex::FArrayBox> *)&local_7a0->super_FabArrayBase)->super_FabArrayBase).
      _vptr_FabArrayBase[1])();
  }
  return;
}

Assistant:

void
MLNodeLaplacian::restrictInteriorNodes (int camrlev, MultiFab& crhs, MultiFab& a_frhs) const
{
    const BoxArray& fba = a_frhs.boxArray();
    const DistributionMapping& fdm = a_frhs.DistributionMap();
    const int amrrr = AMRRefRatio(camrlev);

    MultiFab* frhs = nullptr;
    std::unique_ptr<MultiFab> mf;
    if (a_frhs.nGrowVect().allGE(IntVect(amrrr-1)))
    {
        frhs = &a_frhs;
    }
    else
    {
        mf = std::make_unique<MultiFab>(fba, fdm, 1, amrrr-1);
        frhs = mf.get();
        MultiFab::Copy(*frhs, a_frhs, 0, 0, 1, 0);
    }

    const Geometry& cgeom = m_geom[camrlev  ][0];
    const Geometry& fgeom = m_geom[camrlev+1][0];

    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    const iMultiFab& fdmsk = *m_dirichlet_mask[camrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[camrlev+1];

    MultiFab cfine(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    frhs->setBndry(0.0);
    frhs->FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cfine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = cfine.array(mfi);
        Array4<Real const> const& ffab = frhs->const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }

    MultiFab tmp_crhs(crhs.boxArray(), crhs.DistributionMap(), 1, 0);
    tmp_crhs.setVal(0.0);
    tmp_crhs.ParallelCopy(cfine, cgeom.periodicity());

    const iMultiFab& c_nd_mask = *m_nd_fine_mask[camrlev];
    const auto& has_fine_bndry = *m_has_fine_bndry[camrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crhs, mfi_info); mfi.isValid(); ++mfi)
    {
        if (has_fine_bndry[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& dfab = crhs.array(mfi);
            Array4<Real const> const& sfab = tmp_crhs.const_array(mfi);
            Array4<int const> const& mfab = c_nd_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
            {
                if (mfab(i,j,k) == fine_node) dfab(i,j,k) = sfab(i,j,k);
            });
        }
    }
}